

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

void bson_iter_array(bson_iter_t *iter,uint32_t *array_len,uint8_t **array)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (iter == (bson_iter_t *)0x0) {
    pcVar2 = "iter";
    uVar1 = 0x712;
  }
  else if (array_len == (uint32_t *)0x0) {
    pcVar2 = "array_len";
    uVar1 = 0x713;
  }
  else {
    if (array != (uint8_t **)0x0) {
      *array = (uint8_t *)0x0;
      *array_len = 0;
      if (iter->raw[iter->type] == '\x04') {
        *array_len = *(uint32_t *)(iter->raw + iter->d1);
        *array = iter->raw + iter->d1;
      }
      return;
    }
    pcVar2 = "array";
    uVar1 = 0x714;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,uVar1,"bson_iter_array",pcVar2);
  abort();
}

Assistant:

void
bson_iter_array (const bson_iter_t *iter, /* IN */
                 uint32_t *array_len,     /* OUT */
                 const uint8_t **array)   /* OUT */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (array_len);
   BSON_ASSERT (array);

   *array = NULL;
   *array_len = 0;

   if (ITER_TYPE (iter) == BSON_TYPE_ARRAY) {
      memcpy (array_len, (iter->raw + iter->d1), sizeof (*array_len));
      *array_len = BSON_UINT32_FROM_LE (*array_len);
      *array = (iter->raw + iter->d1);
   }
}